

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdsystem.cpp
# Opt level: O1

SQInteger sqstd_register_systemlib(HSQUIRRELVM v)

{
  undefined8 uVar1;
  long lVar2;
  char *pcVar3;
  
  pcVar3 = "getenv";
  lVar2 = 0x20;
  do {
    sq_pushstring(v,pcVar3,0xffffffffffffffff);
    uVar1 = *(undefined8 *)((long)&stringlib_funcs[9].nparamscheck + lVar2);
    sq_newclosure(v,*(undefined8 *)((long)&stringlib_funcs[9].f + lVar2),0);
    sq_setparamscheck(v,uVar1,*(undefined8 *)((long)&stringlib_funcs[9].typemask + lVar2));
    sq_setnativeclosurename(v,0xffffffffffffffff,pcVar3);
    sq_newslot(v,0xfffffffffffffffd,0);
    pcVar3 = *(char **)((long)&systemlib_funcs[0].name + lVar2);
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x100);
  return 1;
}

Assistant:

SQInteger sqstd_register_systemlib(HSQUIRRELVM v)
{
    SQInteger i=0;
    while(systemlib_funcs[i].name!=0)
    {
        sq_pushstring(v,systemlib_funcs[i].name,-1);
        sq_newclosure(v,systemlib_funcs[i].f,0);
        sq_setparamscheck(v,systemlib_funcs[i].nparamscheck,systemlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,systemlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    return 1;
}